

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall optimization::graph_color::Conflict_Map::remove_edge_less_colors(Conflict_Map *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  iterator iter;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  vars_to_remove;
  VarId local_40;
  
  if ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &vars_to_remove._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var4 = (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var2 = p_Var4[1]._M_color;
      vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Var3 = this->color_num;
      vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (_Var2 < _Var3) {
        for (; (p_Var5 = vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_header *)p_Var4 != &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header &&
               (p_Var4[1]._M_color < this->color_num));
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          std::
          _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
                    ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                      *)&vars_to_remove,*(_Base_ptr *)(p_Var4 + 2),
                     (_Rb_tree_const_iterator<mir::inst::VarId>)&p_Var4[1]._M_left);
        }
        for (; (_Rb_tree_header *)p_Var5 != p_Var1;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          local_40.id = *(uint32_t *)&p_Var5[1]._M_parent;
          local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          remove_node(this,&local_40,true);
        }
      }
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree(&vars_to_remove._M_t);
    } while ((_Var2 < _Var3) &&
            ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0));
  }
  return;
}

Assistant:

void remove_edge_less_colors() {
    while (true) {
      if (!edge_vars.size()) {
        return;
      }
      auto min_edge_iter = edge_vars.begin();
      auto min_edge = min_edge_iter->first;
      std::set<mir::inst::VarId> vars_to_remove;
      if (min_edge >= color_num) {
        return;
      }
      for (auto iter = edge_vars.begin();
           iter != edge_vars.end() && iter->first < color_num; ++iter) {
        vars_to_remove.insert(iter->second.begin(), iter->second.end());
      }
      for (auto var : vars_to_remove) {
        remove_node(var);
      }
    }
  }